

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_dotted_table
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,table_type *t,
          table_format_info *fmt,source_location *param_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  basic_value<toml::type_config> *this_00;
  table_format_info *ptVar1;
  table_type *t_00;
  char (*s) [4];
  __node_base *p_Var2;
  source_location local_c8;
  string_type local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var2 = &(t->_M_h)._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      return __return_storage_ptr__;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(keys,(value_type *)(p_Var2 + 1));
    this_00 = (basic_value<toml::type_config> *)(p_Var2 + 5);
    if (this_00->type_ == table) {
      ptVar1 = basic_value<toml::type_config>::as_table_fmt(this_00);
      if (ptVar1->fmt == oneline) goto LAB_003504d9;
      ptVar1 = basic_value<toml::type_config>::as_table_fmt(this_00);
      if (ptVar1->fmt == multiline_oneline) goto LAB_003504d9;
      t_00 = basic_value<toml::type_config>::as_table_abi_cxx11_(this_00);
      ptVar1 = basic_value<toml::type_config>::as_table_fmt(this_00);
      source_location::source_location(&local_c8,(region *)(p_Var2 + 0xe));
      format_dotted_table(&local_50,this,t_00,ptVar1,&local_c8,keys);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      source_location::~source_location(&local_c8);
    }
    else {
LAB_003504d9:
      format_comments_abi_cxx11_
                ((string_type *)&local_c8,this,(preserve_comments *)(p_Var2 + 0x1b),fmt->indent_type
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      format_indent_abi_cxx11_((string_type *)&local_c8,this,fmt->indent_type);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      format_keys((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c8,this,keys);
      if ((char)local_c8.last_line_ == '\0') {
        std::__throw_bad_optional_access();
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8);
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<4ul>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)" = ",s);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      this->force_inline_ = true;
      operator()[abi_cxx11_((string_type *)&local_c8,this,this_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,'\n');
      this->force_inline_ = false;
    }
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)keys);
  } while( true );
}

Assistant:

string_type format_dotted_table(const table_type& t, const table_format_info& fmt, // {{{
            const source_location&, std::vector<string_type>& keys)
    {
        // lets say we have: `{"a": {"b": {"c": {"d": "foo", "e": "bar"} } }`
        // and `a` and `b` are `dotted`.
        //
        // - in case if `c` is `oneline`:
        // ```toml
        // a.b.c = {d = "foo", e = "bar"}
        // ```
        //
        // - in case if and `c` is `dotted`:
        // ```toml
        // a.b.c.d = "foo"
        // a.b.c.e = "bar"
        // ```

        string_type retval;

        for(const auto& kv : t)
        {
            const auto& key = kv.first;
            const auto& val = kv.second;

            keys.push_back(key);

            // format recursive dotted table?
            if (val.is_table() &&
                val.as_table_fmt().fmt != table_format::oneline &&
                val.as_table_fmt().fmt != table_format::multiline_oneline)
            {
                retval += this->format_dotted_table(val.as_table(), val.as_table_fmt(), val.location(), keys);
            }
            else // non-table or inline tables. format normally
            {
                retval += format_comments(val.comments(), fmt.indent_type);
                retval += format_indent(fmt.indent_type);
                retval += format_keys(keys).value();
                retval += string_conv<string_type>(" = ");
                this->force_inline_ = true; // sub-table must be inlined
                retval += (*this)(val);
                retval += char_type('\n');
                this->force_inline_ = false;
            }
            keys.pop_back();
        }
        return retval;
    }